

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

Vec_Int_t * Mop_ManFindDist1Pairs(Mop_Man_t *p,Vec_Int_t *vGroup)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  word *pCube1_00;
  word *pwVar4;
  word *__s2;
  word *pCube2;
  word *pCube2Out;
  word *pCube1;
  word *pCube1Out;
  Vec_Int_t *vPairs;
  int iCube2;
  int iCube1;
  int c2;
  int c1;
  Vec_Int_t *vGroup_local;
  Mop_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  for (iCube1 = 0; iVar1 = Vec_IntSize(vGroup), iCube1 < iVar1; iCube1 = iCube1 + 1) {
    iVar1 = Vec_IntEntry(vGroup,iCube1);
    pCube1_00 = Mop_ManCubeIn(p,iVar1);
    iCube2 = iCube1;
    while( true ) {
      iCube2 = iCube2 + 1;
      iVar2 = Vec_IntSize(vGroup);
      if (iVar2 <= iCube2) break;
      iVar2 = Vec_IntEntry(vGroup,iCube2);
      pwVar4 = Mop_ManCubeIn(p,iVar2);
      iVar3 = Mop_ManCheckDist1(pCube1_00,pwVar4,p->nWordsIn);
      if (iVar3 != 0) {
        pwVar4 = Mop_ManCubeOut(p,iVar1);
        __s2 = Mop_ManCubeOut(p,iVar2);
        iVar2 = memcmp(pwVar4,__s2,(long)p->nWordsOut << 3);
        if (iVar2 == 0) {
          Vec_IntPushTwo(p_00,iCube1,iCube2);
        }
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mop_ManFindDist1Pairs( Mop_Man_t * p, Vec_Int_t * vGroup )
{
    int c1, c2, iCube1, iCube2;
    Vec_Int_t * vPairs = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vGroup, iCube1, c1 )
    {
        word * pCube1Out, * pCube1 = Mop_ManCubeIn( p, iCube1 );
        Vec_IntForEachEntryStart( vGroup, iCube2, c2, c1+1 )
        {
            word * pCube2Out, * pCube2 = Mop_ManCubeIn( p, iCube2 );
            if ( !Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) )
                continue;
            pCube1Out = Mop_ManCubeOut( p, iCube1 );
            pCube2Out = Mop_ManCubeOut( p, iCube2 );
            if ( !memcmp(pCube1Out, pCube2Out, sizeof(word)*p->nWordsOut) )
                Vec_IntPushTwo( vPairs, c1, c2 );
        }
    }
    return vPairs;
}